

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSubpassDescription2 * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSubpassDescription2>
          (Impl *this,VkSubpassDescription2 *src,size_t count,ScratchAllocator *alloc)

{
  VkSubpassDescription2 *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSubpassDescription2>(alloc,count);
    if (pVVar1 != (VkSubpassDescription2 *)0x0) {
      pVVar1 = (VkSubpassDescription2 *)memmove(pVVar1,src,count * 0x58);
      return pVVar1;
    }
  }
  return (VkSubpassDescription2 *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}